

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinder_Specifiers.cpp
# Opt level: O1

Action __thiscall
psy::C::DeclarationBinder::visitTagDeclarationAsSpecifier
          (DeclarationBinder *this,TagDeclarationAsSpecifierSyntax *node)

{
  TagTypeSpecifierSyntax *this_00;
  Action AVar1;
  SyntaxKind SVar2;
  Identifier *pIVar3;
  Type *ty;
  ostream *poVar4;
  Action AVar5;
  SyntaxToken SStack_58;
  
  AVar1 = SyntaxVisitor::visit(&this->super_SyntaxVisitor,(SyntaxNode *)node->tagDecl_);
  AVar5 = Quit;
  if (AVar1 != Quit) {
    this_00 = node->tagDecl_->typeSpec_;
    SVar2 = SyntaxNode::kind((SyntaxNode *)this_00);
    if (SVar2 == EnumTypeSpecifier) {
      SyntaxNode::tokenAtIndex(&SStack_58,(SyntaxNode *)this_00,this_00->tagTkIdx_);
      pIVar3 = obtainKnownTag(this,&SStack_58);
      ty = &makeType<psy::C::TagType,psy::C::TagTypeKind,psy::C::Identifier_const*>
                      (this,Enum,pIVar3)->super_Type;
    }
    else if (SVar2 == UnionTypeSpecifier) {
      SyntaxNode::tokenAtIndex(&SStack_58,(SyntaxNode *)this_00,this_00->tagTkIdx_);
      pIVar3 = obtainKnownTag(this,&SStack_58);
      ty = &makeType<psy::C::TagType,psy::C::TagTypeKind,psy::C::Identifier_const*>
                      (this,Union,pIVar3)->super_Type;
    }
    else {
      if (SVar2 != StructTypeSpecifier) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Specifiers.cpp"
                   ,0x6b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1e0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<empty message>",0xf);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        return Quit;
      }
      SyntaxNode::tokenAtIndex(&SStack_58,(SyntaxNode *)this_00,this_00->tagTkIdx_);
      pIVar3 = obtainKnownTag(this,&SStack_58);
      ty = &makeType<psy::C::TagType,psy::C::TagTypeKind,psy::C::Identifier_const*>
                      (this,Struct,pIVar3)->super_Type;
    }
    SyntaxToken::~SyntaxToken(&SStack_58);
    pushType(this,ty);
    AVar5 = Skip;
  }
  return AVar5;
}

Assistant:

SyntaxVisitor::Action DeclarationBinder::visitTagDeclarationAsSpecifier(
        const TagDeclarationAsSpecifierSyntax* node)
{
    VISIT(node->tagDeclaration());

    const TagTypeSpecifierSyntax* tySpec = node->tagDeclaration()->typeSpecifier();
    TagType* tagTy = nullptr;
    switch (tySpec->kind()) {
        case SyntaxKind::StructTypeSpecifier:
            tagTy = makeType<TagType>(
                        TagTypeKind::Struct,
                        obtainKnownTag(tySpec->tagToken()));
            break;

        case SyntaxKind::UnionTypeSpecifier:
            tagTy = makeType<TagType>(
                        TagTypeKind::Union,
                        obtainKnownTag(tySpec->tagToken()));
            break;

        case SyntaxKind::EnumTypeSpecifier:
            tagTy = makeType<TagType>(
                        TagTypeKind::Enum,
                        obtainKnownTag(tySpec->tagToken()));
            break;

        default:
            PSY_ASSERT_1(false);
            return Action::Quit;
    }
    pushType(tagTy);

    return Action::Skip;
}